

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O1

void * cf_lite_queue_pop_front(cf_lite_queue_t *self)

{
  cf_size_t cVar1;
  void *pvVar2;
  
  if (self->count == 0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = (void *)((ulong)self->head * self->elm_size + (long)self->items);
    cVar1 = self->count - 1;
    self->count = cVar1;
    if (cVar1 == 0) {
      self->head = 0;
      self->tail = 0;
    }
    else {
      self->head = (cf_uint_t)((ulong)(self->head + 1) % self->capacity);
    }
  }
  return pvVar2;
}

Assistant:

void* cf_lite_queue_pop_front(cf_lite_queue_t* self) {
    void* data = CF_NULL_PTR;
    if (cf_lite_queue_empty(self)) {
        return CF_NULL_PTR;
    }
    data = cf_lite_queue_front(self);
    self->count--;
    if (self->count == 0) {
        self->head = 0;
        self->tail = 0;
    } else {
        self->head = (self->head + 1) % self->capacity;
    }
    return data;
}